

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePiram>_>::ComputeRequiredData
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePiram>_> *this,
          TPZMaterialDataT<double> *data,TPZVec<double> *qsi)

{
  int64_t iVar1;
  TPZMaterialData *in_RDX;
  TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePiram>_> *in_RSI;
  TPZInterpolationSpace *in_RDI;
  TPZMaterialDataT<double> *in_stack_ffffffffffffffd8;
  
  TPZInterpolationSpace::ComputeRequiredData
            (in_RDI,in_stack_ffffffffffffffd8,(TPZVec<double> *)0x1aec98c);
  iVar1 = TPZVec<long>::size((TPZVec<long> *)&in_RDI[5].super_TPZCompEl.fReferenceIndex);
  if (iVar1 != 0) {
    iVar1 = GetGlobalIntegrationPointIndex(in_RSI,in_RDX);
    *(int *)((long)in_RSI[0xe].super_TPZCompElH1<pzshape::TPZShapePiram>.fConnectIndexes.fExtAlloc +
            0x2c) = (int)iVar1;
  }
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::ComputeRequiredData(TPZMaterialDataT<STATE> &data,
                                                         TPZVec<REAL> &qsi){
    TBASE::ComputeRequiredData(data, qsi);
    if(fIntPtIndices.size())
    {
        data.intGlobPtIndex = GetGlobalIntegrationPointIndex(data);
    }
    //material index for the n-th CompEl integration point
}